

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

type_conflict CLI::detail::checked_multiply<unsigned_long>(unsigned_long *a,unsigned_long b)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  uVar1 = *a;
  if (((b != 0 && uVar1 != 0) && (b != 1 && uVar1 != 1)) &&
     (auVar2._8_8_ = 0, auVar2._0_8_ = uVar1, auVar3._8_8_ = 0, auVar3._0_8_ = b,
     SUB168(auVar2 * auVar3,8) != 0)) {
    return false;
  }
  *a = uVar1 * b;
  return true;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, bool>::type checked_multiply(T &a, T b) {
    if(a == 0 || b == 0 || a == 1 || b == 1) {
        a *= b;
        return true;
    }
    if(a == (std::numeric_limits<T>::min)() || b == (std::numeric_limits<T>::min)()) {
        return false;
    }
    if(overflowCheck(a, b)) {
        return false;
    }
    a *= b;
    return true;
}